

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::remove_quotes(string *str)

{
  byte bVar1;
  byte *pbVar2;
  __const_iterator __first;
  uint uVar3;
  
  if (1 < str->_M_string_length) {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    bVar1 = *pbVar2;
    uVar3 = bVar1 - 0x22;
    if (((uVar3 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) &&
       (bVar1 == pbVar2[str->_M_string_length - 1])) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(str)
      ;
      __first._M_current = (str->_M_dataplus)._M_p;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,__first,(__const_iterator)(__first._M_current + 1));
    }
  }
  return str;
}

Assistant:

CLI11_INLINE std::string &remove_quotes(std::string &str) {
    if(str.length() > 1 && (str.front() == '"' || str.front() == '\'' || str.front() == '`')) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}